

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_tables.cpp
# Opt level: O0

void ImGui::TableEndCell(ImGuiTable *table)

{
  ImGuiWindow *pIVar1;
  ImGuiTableColumn *pIVar2;
  float fVar3;
  float *local_30;
  float *local_28;
  float *p_max_pos_x;
  ImGuiWindow *window;
  ImGuiTableColumn *column;
  ImGuiTable *table_local;
  
  pIVar2 = ImSpan<ImGuiTableColumn>::operator[](&table->Columns,table->CurrentColumn);
  pIVar1 = table->InnerWindow;
  if ((*(uint *)&table->field_0x98 & 1) == 0) {
    if ((table->IsUnfrozenRows & 1U) == 0) {
      local_30 = &pIVar2->ContentMaxXFrozen;
    }
    else {
      local_30 = &pIVar2->ContentMaxXUnfrozen;
    }
    local_28 = local_30;
  }
  else {
    local_28 = &pIVar2->ContentMaxXHeadersUsed;
  }
  fVar3 = ImMax<float>(*local_28,(pIVar1->DC).CursorMaxPos.x);
  *local_28 = fVar3;
  fVar3 = ImMax<float>(table->RowPosY2,(pIVar1->DC).CursorMaxPos.y + table->CellPaddingY);
  table->RowPosY2 = fVar3;
  pIVar2->ItemWidth = (pIVar1->DC).ItemWidth;
  fVar3 = ImMax<float>(table->RowTextBaseline,(pIVar1->DC).PrevLineTextBaseOffset);
  table->RowTextBaseline = fVar3;
  return;
}

Assistant:

void ImGui::TableEndCell(ImGuiTable* table)
{
    ImGuiTableColumn* column = &table->Columns[table->CurrentColumn];
    ImGuiWindow* window = table->InnerWindow;

    // Report maximum position so we can infer content size per column.
    float* p_max_pos_x;
    if (table->RowFlags & ImGuiTableRowFlags_Headers)
        p_max_pos_x = &column->ContentMaxXHeadersUsed;  // Useful in case user submit contents in header row that is not a TableHeader() call
    else
        p_max_pos_x = table->IsUnfrozenRows ? &column->ContentMaxXUnfrozen : &column->ContentMaxXFrozen;
    *p_max_pos_x = ImMax(*p_max_pos_x, window->DC.CursorMaxPos.x);
    table->RowPosY2 = ImMax(table->RowPosY2, window->DC.CursorMaxPos.y + table->CellPaddingY);
    column->ItemWidth = window->DC.ItemWidth;

    // Propagate text baseline for the entire row
    // FIXME-TABLE: Here we propagate text baseline from the last line of the cell.. instead of the first one.
    table->RowTextBaseline = ImMax(table->RowTextBaseline, window->DC.PrevLineTextBaseOffset);
}